

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
geemuboi::test::core::CpuTest_ld_ma16_sp_Test::TestBody(CpuTest_ld_ma16_sp_Test *this)

{
  undefined2 uVar1;
  bool bVar2;
  MockSpec<unsigned_short_(unsigned_short)> *this_00;
  TypedExpectation<unsigned_short_(unsigned_short)> *this_01;
  MockSpec<void_(unsigned_short,_unsigned_short)> *this_02;
  pointer pIVar3;
  char *message;
  AssertHelper local_138;
  Message local_130;
  int local_128;
  uint local_124;
  undefined1 local_120 [8];
  AssertionResult gtest_ar;
  Registers expected_regs;
  Matcher<unsigned_short> local_e8;
  MockSpec<void_(unsigned_short,_unsigned_short)> local_d0;
  ReturnAction<int> local_98;
  Action<unsigned_short_(unsigned_short)> local_88;
  WithoutMatchers local_55 [13];
  Matcher<unsigned_short> local_48;
  MockSpec<unsigned_short_(unsigned_short)> local_30;
  CpuTest_ld_ma16_sp_Test *local_10;
  CpuTest_ld_ma16_sp_Test *this_local;
  
  (this->super_CpuTest).regs.sp = 0xffee;
  uVar1 = (this->super_CpuTest).regs.pc;
  local_10 = this;
  testing::Matcher<unsigned_short>::Matcher(&local_48,uVar1 + 1);
  MockMmu::gmock_read_word(&local_30,&(this->super_CpuTest).mmu,&local_48);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<unsigned_short_(unsigned_short)>::operator()
                      (&local_30,local_55,(void *)0x0);
  this_01 = testing::internal::MockSpec<unsigned_short_(unsigned_short)>::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
                       ,0xe3,"mmu","read_word(regs.pc + 1)");
  testing::Return<int>((testing *)&local_98,0xccdd);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_88,(ReturnAction *)&local_98);
  testing::internal::TypedExpectation<unsigned_short_(unsigned_short)>::WillOnce(this_01,&local_88);
  testing::Action<unsigned_short_(unsigned_short)>::~Action(&local_88);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_98);
  testing::internal::MockSpec<unsigned_short_(unsigned_short)>::~MockSpec(&local_30);
  testing::Matcher<unsigned_short>::~Matcher(&local_48);
  testing::Matcher<unsigned_short>::Matcher(&local_e8,0xccdd);
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&expected_regs.pc,(this->super_CpuTest).regs.sp);
  MockMmu::gmock_write_word
            (&local_d0,&(this->super_CpuTest).mmu,&local_e8,
             (Matcher<unsigned_short> *)&expected_regs.pc);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<void_(unsigned_short,_unsigned_short)>::operator()
                      (&local_d0,(WithoutMatchers *)&expected_regs.f,(void *)0x0);
  testing::internal::MockSpec<void_(unsigned_short,_unsigned_short)>::InternalExpectedAt
            (this_02,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
             ,0xe4,"mmu","write_word(0xCCDD, regs.sp)");
  testing::internal::MockSpec<void_(unsigned_short,_unsigned_short)>::~MockSpec(&local_d0);
  testing::Matcher<unsigned_short>::~Matcher((Matcher<unsigned_short> *)&expected_regs.pc);
  testing::Matcher<unsigned_short>::~Matcher(&local_e8);
  CpuTest::execute_instruction(&this->super_CpuTest,'\b');
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  expected_regs.a = '\x03';
  expected_regs.b = '\0';
  expected_regs.c = 0xee;
  expected_regs.d = 0xff;
  CpuTest::verify_state_changes(&this->super_CpuTest,(Registers *)&gtest_ar.message_);
  pIVar3 = std::unique_ptr<geemuboi::core::ICpu,_std::default_delete<geemuboi::core::ICpu>_>::
           operator->(&(this->super_CpuTest).cpu);
  local_124 = (*pIVar3->_vptr_ICpu[1])();
  local_128 = 5;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_120,"cpu->get_cycles_executed()","5",&local_124,&local_128);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar2) {
    testing::Message::Message(&local_130);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
               ,0xec,message);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  return;
}

Assistant:

TEST_F(CpuTest, ld_ma16_sp) {
    regs.sp = 0xFFEE;
    EXPECT_CALL(mmu, read_word(regs.pc + 1)).WillOnce(Return(0xCCDD));
    EXPECT_CALL(mmu, write_word(0xCCDD, regs.sp));
    execute_instruction(0x08);

    ICpu::Registers expected_regs{};
    expected_regs.sp = 0xFFEE;
    expected_regs.pc = 3;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 5);
}